

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILS.h
# Opt level: O1

double __thiscall
imrt::ILS::notTargetedSearch(ILS *this,Plan *current_plan,int max_time,int max_iterations)

{
  long lVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  clock_t cVar5;
  Plan *this_00;
  ostream *poVar6;
  int iVar7;
  bool bVar8;
  ulong uVar9;
  float fVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  double dVar12;
  double dVar13;
  double local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  double local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"## Staring ILS search.",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  cVar5 = clock();
  this->time_begin = cVar5;
  this_00 = (Plan *)operator_new(0xd0);
  Plan::Plan(this_00,current_plan);
  local_80 = Plan::getEvaluation(current_plan);
  dVar2 = (double)max_time;
  dVar13 = 0.0;
  local_48 = 0.0;
  bVar8 = true;
  iVar7 = 1;
  bVar3 = true;
  local_78 = SUB84(local_80,0);
  uStack_74 = (undefined4)((ulong)local_80 >> 0x20);
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Iteration: ",0xb);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", eval: ",8);
    poVar6 = (ostream *)
             std::ostream::operator<<((ostream *)poVar6,EvaluationFunction::n_evaluations);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", time: ",8);
    fVar10 = roundf((float)(dVar13 * 1000.0));
    poVar6 = std::ostream::_M_insert<double>((double)(fVar10 / 1000.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", best: ",8);
    poVar6 = std::ostream::_M_insert<double>(local_80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", current: ",0xb);
    poVar6 = std::ostream::_M_insert<double>((double)CONCAT44(uStack_74,local_78));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (!bVar8) {
      (*this->_vptr_ILS[8])(this,current_plan);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Iteration: ",0xb);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", per: ",7);
      poVar6 = std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      local_78 = extraout_XMM0_Da;
      uStack_74 = extraout_XMM0_Db;
    }
    uVar11 = SUB84(local_48,0);
    if (max_time != 0) {
      uVar11 = SUB84(dVar2 - dVar13,0);
    }
    (*this->_vptr_ILS[3])(uVar11,this,current_plan,0);
    uVar9 = -(ulong)(1e-05 < (double)CONCAT44(uStack_74,local_78) -
                             (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    dVar13 = (double)(~uVar9 & CONCAT44(uStack_74,local_78) |
                     CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) & uVar9);
    if (1e-05 < local_80 - dVar13) {
      Plan::newCopy(this_00,current_plan);
      local_80 = dVar13;
    }
    cVar5 = clock();
    dVar12 = (double)(cVar5 - this->time_begin) / 1000000.0;
    if ((max_time != 0) && (dVar2 <= dVar12)) break;
    if (max_time != 0) {
      local_48 = dVar2 - dVar12;
    }
    (*this->_vptr_ILS[4])(SUB84(local_48,0),this,current_plan,0);
    dVar12 = dVar13 - (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    bVar8 = 1e-05 < dVar12;
    local_78 = extraout_XMM0_Da_01;
    uStack_74 = extraout_XMM0_Db_01;
    if (dVar12 <= 1e-05) {
      local_78 = SUB84(dVar13,0);
      uStack_74 = (undefined4)((ulong)dVar13 >> 0x20);
    }
    if (1e-05 < local_80 - (double)CONCAT44(uStack_74,local_78)) {
      Plan::newCopy(this_00,current_plan);
      local_80 = (double)CONCAT44(uStack_74,local_78);
    }
    iVar7 = iVar7 + 1;
    cVar5 = clock();
    dVar13 = (double)(cVar5 - this->time_begin) / 1000000.0;
    bVar4 = false;
    if (dVar13 < dVar2) {
      bVar4 = bVar3;
    }
    if (max_time == 0) {
      bVar4 = bVar3;
    }
    bVar3 = false;
    if (iVar7 < max_iterations) {
      bVar3 = bVar4;
    }
    if (max_iterations == 0) {
      bVar3 = bVar4;
    }
  } while (bVar3);
  Plan::newCopy(current_plan,this_00);
  dVar2 = Plan::getEvaluation(current_plan);
  EvaluationFunction::generate_voxel_dose_functions(this_00->ev);
  cVar5 = clock();
  lVar1 = this->time_begin;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"## Total used time: ",0x14);
  poVar6 = std::ostream::_M_insert<double>((double)(cVar5 - lVar1) / 1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return dVar2;
}

Assistant:

double notTargetedSearch(Plan& current_plan, int max_time, int max_iterations) {

    cout << "## Staring ILS search." << endl;
    std::clock_t time_end;

    //Start time
    time_begin=clock();

    //Best plan found so far
    Plan& best_plan= *new Plan(current_plan);

    double local_eval, aux_eval,  best_eval;
    double used_time=0;
    double ls_time=0;
    // flag is used for the termination criterion
    bool flag=true;
    // improvement signals a new best solution found
    bool improvement=true;
    int no_improvement, iteration=1, perturbation_iteration=0;
    no_improvement = 0;
    
    best_eval = local_eval = current_plan.getEvaluation();
    while (flag) {
      cout << "Iteration: " << iteration << ", eval: " << 
              EvaluationFunction::n_evaluations << 
              ", time: "<< (roundf(used_time * 1000) / 1000)  << 
              ", best: " << best_eval << ", current: " << 
              local_eval << endl;
      
      // Perturbate if we haven't improved last iteration
      if (!improvement) {
        local_eval = perturbation(current_plan);
        cout << "Iteration: " << iteration << ", per: " << local_eval << endl;
      }
      
      improvement = false;

      // Track the used time
      if (max_time!=0) ls_time = max_time - used_time;
      
      // Apply intensity ls
      aux_eval = iLocalSearch (current_plan, ls_time, false);
      // Check if there if there is a new solution was found
      if ((local_eval - aux_eval) > 0.00001) {
        local_eval = aux_eval;
      }
      
      // Check if there is a better global best
      if ((best_eval - local_eval) > 0.00001) {
        best_eval = local_eval;
        best_plan.newCopy(current_plan);
      }
      
      //Check print (comment if not needed)
      /*current_plan.eval();
      cout << "returned eval: " << aux_eval << " current local: " << local_eval << " in current plan: " << current_plan.getEvaluation()<< endl;
      cout << endl;
      for(int j=0;j<5;j++)
      current_plan.printIntensity(j);
      cout << endl;*/
      
      // Check termination criterion
      time_end = clock();
      used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
      if (max_time!=0 && used_time >= max_time) {
        flag = false;
        break;
      }
      // Update used time
      if (max_time!=0) ls_time = max_time-used_time;
      
      // Apply aperture ls
      aux_eval = aLocalSearch (current_plan, ls_time , false);
      // Check if there if there is a new solution was found
      if ((local_eval - aux_eval) > 0.00001) {
        local_eval = aux_eval;
        improvement = true;
      }
      
      // Check if there is a better global best
      if ((best_eval - local_eval) > 0.00001) {
        best_eval = local_eval;
        best_plan.newCopy(current_plan);
      }

      iteration++;

      // Check termination criterion
      time_end=clock();
      used_time=double(time_end- time_begin) / CLOCKS_PER_SEC;
      if (max_time!=0 && used_time >= max_time) flag = false;
      if (max_iterations!=0 && iteration>=max_iterations) flag = false;
    }

    current_plan.newCopy(best_plan);
    aux_eval = current_plan.getEvaluation();
    best_plan.getEvaluationFunction()->generate_voxel_dose_functions();
    
    time_end = clock();
    used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
    cout << "## Total used time: " << used_time << endl;
    return(aux_eval);
  }